

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddWindowToSortedBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow *window_00;
  ImGuiWindow **__dest;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t __nmemb;
  
  iVar1 = out_sorted_windows->Capacity;
  if (out_sorted_windows->Size == iVar1) {
    iVar3 = out_sorted_windows->Size + 1;
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    if (iVar1 < iVar3) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar3 << 3,GImAllocatorUserData);
      if (out_sorted_windows->Data != (ImGuiWindow **)0x0) {
        memcpy(__dest,out_sorted_windows->Data,(long)out_sorted_windows->Size << 3);
      }
      if (out_sorted_windows->Data != (ImGuiWindow **)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(out_sorted_windows->Data,GImAllocatorUserData);
      out_sorted_windows->Data = __dest;
      out_sorted_windows->Capacity = iVar3;
    }
  }
  out_sorted_windows->Data[out_sorted_windows->Size] = window;
  out_sorted_windows->Size = out_sorted_windows->Size + 1;
  if (window->Active == true) {
    iVar1 = (window->DC).ChildWindows.Size;
    __nmemb = (size_t)iVar1;
    if (1 < (long)__nmemb) {
      qsort((window->DC).ChildWindows.Data,__nmemb,8,ChildWindowComparer);
    }
    if (0 < iVar1) {
      sVar4 = 0;
      do {
        if ((long)(window->DC).ChildWindows.Size <= (long)sVar4) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                        ,0x49a,
                        "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        window_00 = (window->DC).ChildWindows.Data[sVar4];
        if (window_00->Active == true) {
          AddWindowToSortedBuffer(out_sorted_windows,window_00);
        }
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
    }
  }
  return;
}

Assistant:

static void AddWindowToSortedBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            qsort(window->DC.ChildWindows.begin(), (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortedBuffer(out_sorted_windows, child);
        }
    }
}